

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter_Node.hpp
# Opt level: O0

void __thiscall
CX3DImporter_NodeElement_Material::CX3DImporter_NodeElement_Material
          (CX3DImporter_NodeElement_Material *this,CX3DImporter_NodeElement *pParent)

{
  CX3DImporter_NodeElement *pParent_local;
  CX3DImporter_NodeElement_Material *this_local;
  
  CX3DImporter_NodeElement::CX3DImporter_NodeElement
            (&this->super_CX3DImporter_NodeElement,ENET_Material,pParent);
  (this->super_CX3DImporter_NodeElement)._vptr_CX3DImporter_NodeElement =
       (_func_int **)&PTR__CX3DImporter_NodeElement_Material_0100e6f0;
  this->AmbientIntensity = 0.0;
  aiColor3D::aiColor3D(&this->DiffuseColor);
  aiColor3D::aiColor3D(&this->EmissiveColor);
  this->Shininess = 0.0;
  aiColor3D::aiColor3D(&this->SpecularColor);
  this->Transparency = 1.0;
  return;
}

Assistant:

CX3DImporter_NodeElement_Material(CX3DImporter_NodeElement* pParent)
	: CX3DImporter_NodeElement(ENET_Material, pParent)
	, AmbientIntensity( 0.0f )
	, DiffuseColor()
	, EmissiveColor()
	, Shininess( 0.0f )
	, SpecularColor()
	, Transparency( 1.0f ) {
		// empty
	}